

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testValid_Classifier_PredictedFeatureNameAndTarget(void)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  FeatureDescription *pFVar5;
  NeuralNetworkClassifier *pNVar6;
  Type *this;
  CategoricalCrossEntropyLossLayer *pCVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *this_00;
  ostream *poVar9;
  long lVar10;
  NetworkUpdateParameters *pNVar11;
  void **ppvVar12;
  allocator<char> local_1c9;
  Model spec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  string target;
  FeatureDescription feature;
  _Vector_base<long,_std::allocator<long>_> local_118;
  TensorAttributes tensorAttributesIn;
  Result res;
  string labels [4];
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)labels,"1",(allocator<char> *)&feature);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels + 1),"2",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels + 2),"3",(allocator<char> *)&classLabels);
  std::__cxx11::string::string<std::allocator<char>>((string *)(labels + 3),"4",&local_1c9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&classLabels,
             labels,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffffc8,(allocator_type *)&feature);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_180,&classLabels);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel
            (&spec,true,&tensorAttributesIn,&local_180,
             (vector<long,_std::allocator<long>_> *)&local_118,true);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180);
  spec.specificationversion_ = 4;
  pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar4->traininginput_).super_RepeatedPtrFieldBase);
  pMVar4 = spec.description_;
  if (spec.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar12 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar12 = (void **)0x0;
  }
  iVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar10 = 0; (long)iVar1 * 8 != lVar10; lVar10 = lVar10 + 8) {
    CoreML::Specification::FeatureDescription::FeatureDescription
              (&feature,*(FeatureDescription **)((long)ppvVar12 + lVar10));
    pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
    pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&pMVar4->traininginput_);
    CoreML::Specification::FeatureDescription::CopyFrom(pFVar5,&feature);
    CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
  }
  pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar4->traininginput_);
  pNVar6 = CoreML::Specification::Model::neuralnetworkclassifier(&spec);
  pNVar11 = pNVar6->updateparams_;
  if (pNVar11 == (NetworkUpdateParameters *)0x0) {
    pNVar11 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                   (&(pNVar11->losslayers_).super_RepeatedPtrFieldBase,0);
  pCVar7 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(this);
  std::__cxx11::string::string((string *)&target,(string *)(pCVar7->target_).ptr_);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,&target);
  pFVar8 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar8);
  this_00->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar4->traininginput_);
  if (spec.description_ == (ModelDescription *)0x0) {
    spec.description_ =
         (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  CoreML::Specification::FeatureDescription::set_name
            (pFVar5,((spec.description_)->predictedfeaturename_).ptr_);
  pFVar8 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar8);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar3 = CoreML::Result::good(&res);
  if (!bVar3) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x91c);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"(res).good()");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  std::__cxx11::string::~string((string *)&target);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&classLabels);
  lVar10 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&labels[0]._M_dataplus._M_p + lVar10));
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x20);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return (uint)!bVar3;
}

Assistant:

int testValid_Classifier_PredictedFeatureNameAndTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}